

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.h
# Opt level: O0

void __thiscall LogFile::~LogFile(LogFile *this)

{
  LogFile *this_local;
  
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::~unique_ptr(&this->file_);
  std::unique_ptr<MutexLock,_std::default_delete<MutexLock>_>::~unique_ptr(&this->mutex_);
  std::__cxx11::string::~string((string *)this);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

~LogFile() = default;